

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  u32 iFrame_00;
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *in_RDX;
  u32 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  u32 iFrame;
  u32 iH;
  int rc;
  int nCollide;
  int iKey;
  int iMinHash;
  int iHash;
  u32 iLast;
  u32 iRead;
  WalHashLoc sLoc;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  int local_58;
  int local_54;
  int local_4c;
  uint local_44;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  iFrame_00 = *(u32 *)(in_RDI + 0x58);
  if ((iFrame_00 == 0) || ((*(short *)(in_RDI + 0x3c) == 0 && (*(char *)(in_RDI + 0x46) == '\0'))))
  {
    *in_RDX = 0;
    local_24 = 0;
  }
  else {
    iVar2 = walFramePage(*(u32 *)(in_RDI + 0x78));
    for (local_4c = walFramePage(iFrame_00); iVar2 <= local_4c; local_4c = local_4c + -1) {
      local_24 = walHashGet((Wal *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffff9c,
                            (WalHashLoc *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (local_24 != 0) goto LAB_0015e4e4;
      local_58 = 0x2000;
      local_54 = walHash(in_ESI);
      while( true ) {
        in_stack_ffffffffffffff9c =
             CONCAT22(*(ushort *)(&DAT_aaaaaaaaaaaaaaaa + (long)local_54 * 2),
                      (short)in_stack_ffffffffffffff9c);
        uVar3 = (uint)*(ushort *)(&DAT_aaaaaaaaaaaaaaaa + (long)local_54 * 2);
        if (uVar3 == 0) break;
        uVar4 = uVar3 + 0xaaaaaaaa;
        if (((uVar4 <= iFrame_00) && (*(uint *)(in_RDI + 0x78) <= uVar4)) &&
           (*(u32 *)(&DAT_aaaaaaaaaaaaaaaa + (ulong)(uVar3 - 1) * 4) == in_ESI)) {
          local_44 = uVar4;
        }
        if (local_58 == 0) {
          *in_RDX = 0;
          local_24 = sqlite3CorruptError(0);
          goto LAB_0015e4e4;
        }
        local_54 = walNextHash(local_54);
        local_58 = local_58 + -1;
      }
      if (local_44 != 0) break;
    }
    *in_RDX = local_44;
    local_24 = 0;
  }
LAB_0015e4e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int walFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0,
  ** then the WAL is ignored by the reader so return early, as if the
  ** WAL were empty.
  */
  if( iLast==0 || (pWal->readLock==0 && pWal->bShmUnreliable==0) ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash
  ** table). This means the value just read from the hash
  ** slot (aHash[iKey]) may have been added before or after the
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno):
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast):
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash; iHash--){
    WalHashLoc sLoc;              /* Hash table location */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */
    u32 iH;

    rc = walHashGet(pWal, iHash, &sLoc);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    iKey = walHash(pgno);
    SEH_INJECT_FAULT;
    while( (iH = AtomicLoad(&sLoc.aHash[iKey]))!=0 ){
      u32 iFrame = iH + sLoc.iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && sLoc.aPgno[iH-1]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        *piRead = 0;
        return SQLITE_CORRUPT_BKPT;
      }
      iKey = walNextHash(iKey);
    }
    if( iRead ) break;
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->bShmUnreliable || pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame && iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}